

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Lexer::isHexNumber(Lexer *this,string *token,Type *type)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->_enableHexNumber != true) {
    return false;
  }
  sVar3 = this->_cursor;
  if (((2 < this->_eos - sVar3) && (pcVar1 = (this->_text)._M_dataplus._M_p, pcVar1[sVar3] == '0'))
     && (pcVar1[sVar3 + 1] == 'x')) {
    sVar3 = sVar3 + 1;
    do {
      bVar2 = unicodeHexDigit((int)(this->_text)._M_dataplus._M_p[sVar3 + 1]);
      sVar3 = sVar3 + 1;
    } while (bVar2);
    if (2 < sVar3 - this->_cursor) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)this);
      std::__cxx11::string::operator=((string *)token,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      *type = hex;
      this->_cursor = sVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool Lexer::isHexNumber (std::string& token, Lexer::Type& type)
{
  if (_enableHexNumber)
  {
    std::size_t marker = _cursor;

    if (_eos - marker >= 3 &&
        _text[marker + 0] == '0' &&
        _text[marker + 1] == 'x')
    {
      marker += 2;

      while (unicodeHexDigit (_text[marker]))
        ++marker;

      if (marker - _cursor > 2)
      {
        token = _text.substr (_cursor, marker - _cursor);
        type = Lexer::Type::hex;
        _cursor = marker;
        return true;
      }
    }
  }

  return false;
}